

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O0

prof_tctx_t * prof_tctx_dump_iter(prof_tctx_tree_t *tctxs,prof_tctx_t *tctx,void *opaque)

{
  long in_RDX;
  long in_RSI;
  prof_cnt_t *unaff_retaddr;
  prof_dump_iter_arg_t *arg;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  malloc_mutex_assert_owner
            ((tsdn_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (malloc_mutex_t *)0x2559566);
  if ((1 < *(uint *)(in_RSI + 0x84)) && (*(uint *)(in_RSI + 0x84) - 2 < 2)) {
    prof_dump_printf(*(write_cb_t **)(in_RDX + 8),*(void **)(in_RDX + 0x10),"  t%lu: ",
                     *(undefined8 *)(in_RSI + 8));
    prof_dump_print_cnts((write_cb_t *)opaque,arg,unaff_retaddr);
    (**(code **)(in_RDX + 8))(*(undefined8 *)(in_RDX + 0x10),anon_var_dwarf_3eb6436 + 8);
  }
  return (prof_tctx_t *)0x0;
}

Assistant:

static prof_tctx_t *
prof_tctx_dump_iter(prof_tctx_tree_t *tctxs, prof_tctx_t *tctx, void *opaque) {
	prof_dump_iter_arg_t *arg = (prof_dump_iter_arg_t *)opaque;
	malloc_mutex_assert_owner(arg->tsdn, tctx->gctx->lock);

	switch (tctx->state) {
	case prof_tctx_state_initializing:
	case prof_tctx_state_nominal:
		/* Not captured by this dump. */
		break;
	case prof_tctx_state_dumping:
	case prof_tctx_state_purgatory:
		prof_dump_printf(arg->prof_dump_write, arg->cbopaque,
		    "  t%"FMTu64": ", tctx->thr_uid);
		prof_dump_print_cnts(arg->prof_dump_write, arg->cbopaque,
		    &tctx->dump_cnts);
		arg->prof_dump_write(arg->cbopaque, "\n");
		break;
	default:
		not_reached();
	}
	return NULL;
}